

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fLifetimeTests.cpp
# Opt level: O2

void __thiscall
deqp::gles3::Functional::anon_unknown_0::BufferVAOAttacher::attach
          (BufferVAOAttacher *this,GLuint buffer,GLuint vao)

{
  ostringstream *this_00;
  MessageBuilder local_198;
  
  ScaleProgram::setPos(this->m_program,buffer,vao);
  local_198.m_log = ((this->super_Attacher).super_ContextWrapper.m_ctx.m_testCtx)->m_log;
  this_00 = &local_198.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,"// Set the `pos` attribute in VAO ");
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::operator<<((ostream *)this_00," to buffer ");
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  tcu::MessageBuilder::operator<<(&local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  return;
}

Assistant:

void BufferVAOAttacher::attach (GLuint buffer, GLuint vao)
{
	m_program.setPos(buffer, vao);
	log() << TestLog::Message
		  << "// Set the `pos` attribute in VAO " << vao << " to buffer " << buffer
		  << TestLog::EndMessage;
}